

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O2

bool anon_unknown.dwarf_156bd::SolverDpllTriadSimd<0>::InitPencilmarkByBox(char *input,State *state)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  int elm_i;
  long lVar5;
  long lVar6;
  int index;
  undefined1 *puVar7;
  undefined1 *puVar8;
  long lVar9;
  undefined1 auVar10 [16];
  Cells16 box_candidates;
  char buf [736];
  undefined1 *local_398;
  Bitvec16x16 local_360;
  undefined1 local_340 [784];
  
  local_398 = local_340;
  memcpy(local_398,input,0x2d9);
  for (uVar4 = 0; uVar4 != 3; uVar4 = uVar4 + 1) {
    lVar6 = 0;
    puVar8 = local_398;
    while (lVar6 != 3) {
      local_360.vec[1] = 0x1ff01ff01ff01ff;
      local_360.vec[0] = 0x1ff01ff01ff01ff;
      local_360.vec[2] = 0x1ff01ff01ff01ff;
      local_360.vec[3] = 0x1ff01ff01ff01ff;
      iVar3 = 0;
      puVar7 = puVar8;
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        index = iVar3;
        for (lVar9 = 0; lVar9 != 0x1b; lVar9 = lVar9 + 9) {
          auVar10[8] = 0x2e;
          auVar10._0_8_ = 0x2e2e2e2e2e2e2e2e;
          auVar10[9] = 0x2e;
          auVar10[10] = 0x2e;
          auVar10[0xb] = 0x2e;
          auVar10[0xc] = 0x2e;
          auVar10[0xd] = 0x2e;
          auVar10[0xe] = 0x2e;
          auVar10[0xf] = 0x2e;
          uVar1 = vpcmpb_avx512vl(auVar10,*(undefined1 (*) [16])(puVar7 + lVar9),4);
          Bitvec16x16::Insert(&local_360,index,(ushort)uVar1 & 0x1ff);
          index = index + 1;
        }
        puVar7 = puVar7 + 0x51;
        iVar3 = iVar3 + 4;
      }
      bVar2 = BoxRestrict<0>(state,(int)lVar6 + (int)uVar4 * 3,&local_360);
      lVar6 = lVar6 + 1;
      puVar8 = puVar8 + 0x1b;
      if (!bVar2) goto LAB_0010653f;
    }
    local_398 = local_398 + 0xf3;
  }
LAB_0010653f:
  return 2 < uVar4;
}

Assistant:

static bool InitPencilmarkByBox(const char *input, State &state) {
        char buf[736]; // make sure unaligned 16 byte cell reads won't go past end of buffer
        memcpy(&buf, input, 729);
        for (int box_i = 0; box_i < 3; box_i++) {
            for (int box_j = 0; box_j < 3; box_j++) {
                Cells16 box_candidates = Cells16::All(kAll);
                for (int elm_i = 0; elm_i < 3; elm_i++) {
                    for (int elm_j = 0; elm_j < 3; elm_j++) {
                        int cell = box_i * 27 + elm_i * 9 + box_j * 3 + elm_j;
                        auto cell_eliminations = WhichDots16(&buf[cell * 9]);
                        box_candidates.Insert(elm_i * 4 + elm_j, kAll & ~cell_eliminations);
                    }
                }
                if (!BoxRestrict<0>(state, box_i * 3 + box_j, box_candidates)) return false;
            }
        }
        return true;
    }